

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdldl_interface.c
# Opt level: O0

void LDLSolve(c_float *x,c_float *b,csc *L,c_float *Dinv,c_int *P,c_float *bp)

{
  QDLDL_int *in_RCX;
  QDLDL_int *in_RDX;
  c_float *in_RSI;
  c_float *in_RDI;
  QDLDL_float *in_R8;
  c_float *in_R9;
  QDLDL_float *in_stack_ffffffffffffffc8;
  
  permute_x(in_RDX[2],in_R9,in_RSI,(c_int *)in_R8);
  QDLDL_solve((QDLDL_int)in_RSI,in_RDX,in_RCX,in_R8,in_R9,in_stack_ffffffffffffffc8);
  permutet_x(in_RDX[2],in_RDI,in_R9,(c_int *)in_R8);
  return;
}

Assistant:

static void LDLSolve(c_float *x, c_float *b, const csc *L, const c_float *Dinv, const c_int *P, c_float *bp) {
    /* solves P'LDL'P x = b for x */
    permute_x(L->n, bp, b, P);
    QDLDL_solve(L->n, L->p, L->i, L->x, Dinv, bp);
    permutet_x(L->n, x, bp, P);

}